

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_node.cpp
# Opt level: O1

size_t la::trie_node::convertIndex(char *c)

{
  char cVar1;
  
  cVar1 = *c;
  if ((byte)(cVar1 + 0x9fU) < 0x1a) {
    return (ulong)((int)cVar1 - 0x61);
  }
  if ((byte)(cVar1 - 0x30U) < 10) {
    return (ulong)(cVar1 + 0x2aU & 0x3f);
  }
  if (cVar1 == '_') {
    return 0x25;
  }
  if (cVar1 != '.') {
    if (cVar1 == ',') {
      return 0x26;
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/charleswu52[P]LA_CPlusPlus/src/levenshtein_automaton/trie_node.cpp"
                  ,0x1f,"static std::size_t la::trie_node::convertIndex(const char &)");
  }
  return 0x27;
}

Assistant:

std::size_t
    trie_node::convertIndex(const char &c)
    {
        if ('a' <= c && c <= 'z')
            return c - 'a';
        if ('0' <= c && c <= '9')
            return c - '0' + 26;
        if (c == '_')
            return 26 + 10 + 1;
        if (c == ',')
            return 26 + 10 + 2;
        if (c == '.')
            return 26 + 10 + 3;
        assert(false);
        return 0;
    }